

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O3

int intCallback(uint user_gpio,uint edge,void *f,void *user,int ex)

{
  callback_t **ppcVar1;
  callback_t *pcVar2;
  int iVar3;
  callback_t *pcVar4;
  
  pcVar2 = gCallBackFirst;
  if (f == (void *)0x0 || (2 < edge || 0x1f < user_gpio)) {
    return -0x7d8;
  }
  pcVar4 = gCallBackFirst;
  if (gCallBackFirst == (callback_t *)0x0) {
    pcVar4 = (callback_t *)malloc(0x38);
    if (pcVar4 == (callback_t *)0x0) {
      return -0x7d7;
    }
  }
  else {
    do {
      if (((pcVar4->gpio == user_gpio) && (pcVar4->edge == edge)) && (pcVar4->f == (CBF_t)f)) {
        return -0x7d6;
      }
      ppcVar1 = &pcVar4->next;
      pcVar4 = *ppcVar1;
    } while (*ppcVar1 != (callback_t *)0x0);
    pcVar4 = (callback_t *)malloc(0x38);
    if (pcVar4 == (callback_t *)0x0) {
      return -0x7d7;
    }
    if (pcVar2 != (callback_t *)0x0) goto LAB_00106cb1;
  }
  gCallBackFirst = pcVar4;
LAB_00106cb1:
  iVar3 = intCallback::id + 1;
  pcVar4->id = intCallback::id;
  intCallback::id = iVar3;
  pcVar4->gpio = user_gpio;
  pcVar4->edge = edge;
  pcVar4->f = (CBF_t)f;
  pcVar4->user = user;
  pcVar4->ex = ex;
  pcVar4->next = (callback_t *)0x0;
  pcVar4->prev = gCallBackLast;
  if (gCallBackLast != (callback_t *)0x0) {
    gCallBackLast->next = pcVar4;
  }
  gCallBackLast = pcVar4;
  findNotifyBits();
  return pcVar4->id;
}

Assistant:

static int intCallback(unsigned user_gpio, unsigned edge, void *f, void *user, int ex)
{
   static int id = 0;
   callback_t *p;

   if ((user_gpio >=0) && (user_gpio < 32) && (edge >=0) && (edge <= 2) && f)
   {
      /* prevent duplicates */

      p = gCallBackFirst;

      while (p)
      {
         if ((p->gpio == user_gpio) && (p->edge == edge) && (p->f == f))
         {
            return pigif_duplicate_callback;
         }
         p = p->next;
      }

      p = malloc(sizeof(callback_t));

      if (p)
      {
         if (!gCallBackFirst) gCallBackFirst = p;

         p->id = id++;
         p->gpio = user_gpio;
         p->edge = edge;
         p->f = f;
         p->user = user;
         p->ex = ex;
         p->next = 0;
         p->prev = gCallBackLast;

         if (p->prev) (p->prev)->next = p;
         gCallBackLast = p;

         findNotifyBits();

         return p->id;
      }

      return pigif_bad_malloc;
   }

   return pigif_bad_callback;
}